

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FmtHelpers.cpp
# Opt level: O0

bool slang::ast::FmtHelpers::checkDisplayArgs(ASTContext *context,Args *args)

{
  SourceRange sourceRange;
  bool bVar1;
  iterator diag;
  iterator arg_00;
  reference ppEVar2;
  SourceLocation SVar3;
  Expression *in_RDI;
  Type *type;
  Expression *arg;
  iterator argIt;
  iterator in_stack_00000070;
  Type *in_stack_ffffffffffffff88;
  Expression *in_stack_ffffffffffffff90;
  StringLiteral *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffb0;
  iterator in_stack_ffffffffffffffc0;
  __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
  local_38;
  Expression *local_30;
  
  diag = std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::begin
                   ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                    in_stack_ffffffffffffff88);
  while( true ) {
    arg_00 = std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::end
                       ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                        in_stack_ffffffffffffff98);
    bVar1 = __gnu_cxx::
            operator==<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                      ((__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                        *)in_stack_ffffffffffffff90,
                       (__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                        *)in_stack_ffffffffffffff88);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return true;
    }
    local_38 = __gnu_cxx::
               __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
               ::operator++((__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                             *)in_stack_ffffffffffffff98,
                            (int)((ulong)in_stack_ffffffffffffff90 >> 0x20));
    ppEVar2 = __gnu_cxx::
              __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
              ::operator*(&local_38);
    local_30 = *ppEVar2;
    bVar1 = Expression::bad(in_stack_ffffffffffffff90);
    if (bVar1) break;
    if (local_30->kind == StringLiteral) {
      in_stack_ffffffffffffff90 = in_RDI;
      in_stack_ffffffffffffff98 = Expression::as<slang::ast::StringLiteral>(local_30);
      in_stack_ffffffffffffffc0 =
           std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::end
                     ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                      in_stack_ffffffffffffff98);
      bVar1 = checkFormatString(context,(StringLiteral *)args,(iterator *)argIt._M_current,
                                in_stack_00000070);
      if (!bVar1) {
        return false;
      }
    }
    else {
      SVar3 = (SourceLocation)
              not_null<const_slang::ast::Type_*>::operator*
                        ((not_null<const_slang::ast::Type_*> *)0x7321af);
      bVar1 = Type::isAggregate(in_stack_ffffffffffffff88);
      if ((bVar1) && (bVar1 = Type::isByteArray((Type *)in_stack_ffffffffffffff98), !bVar1)) {
        sourceRange.startLoc._4_4_ = 0x17000b;
        sourceRange.startLoc._0_4_ = in_stack_ffffffffffffffb0;
        sourceRange.endLoc = SVar3;
        ASTContext::addDiag((ASTContext *)(local_30->sourceRange).endLoc,
                            SUB84((ulong)in_stack_ffffffffffffffc0._M_current >> 0x20,0),sourceRange
                           );
        ast::operator<<((Diagnostic *)diag._M_current,(Type *)arg_00._M_current);
        return false;
      }
    }
  }
  return false;
}

Assistant:

bool FmtHelpers::checkDisplayArgs(const ASTContext& context, const Args& args) {
    auto argIt = args.begin();
    while (argIt != args.end()) {
        auto arg = *argIt++;
        if (arg->bad())
            return false;

        // Handle string literals as format strings.
        if (arg->kind == ExpressionKind::StringLiteral) {
            if (!checkFormatString(context, arg->as<StringLiteral>(), argIt, args.end()))
                return false;
        }
        else {
            const Type& type = *arg->type;
            if (type.isAggregate() && !type.isByteArray()) {
                context.addDiag(diag::FormatUnspecifiedType, arg->sourceRange) << type;
                return false;
            }
        }
    }

    return true;
}